

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEAngle.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall CEAngle::HmsVect(CEAngle *this)

{
  undefined8 uVar1;
  int iVar2;
  reference pvVar3;
  size_type __n;
  reference pvVar4;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<int,_std::allocator<int>_> *this_00;
  char pm;
  vector<int,_std::allocator<int>_> HMS_i;
  vector<double,_std::allocator<double>_> *HMS_d;
  allocator_type *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  vector<double,_std::allocator<double>_> *this_01;
  undefined1 local_3f [63];
  
  std::allocator<int>::allocator((allocator<int> *)0x1456a0);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (allocator_type *)in_stack_ffffffffffffff80);
  std::allocator<int>::~allocator((allocator<int> *)0x1456c0);
  uVar1 = *(undefined8 *)(in_RSI + 8);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(local_3f + 0x17),0);
  iauA2tf(uVar1,9,local_3f + 2,pvVar3);
  local_3f[1] = 0;
  __n = std::vector<int,_std::allocator<int>_>::size
                  ((vector<int,_std::allocator<int>_> *)(local_3f + 0x17));
  this_01 = (vector<double,_std::allocator<double>_> *)local_3f;
  std::allocator<double>::allocator((allocator<double> *)0x14571b);
  std::vector<double,_std::allocator<double>_>::vector(this_01,__n,in_stack_ffffffffffffff80);
  std::allocator<double>::~allocator((allocator<double> *)0x14573b);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(local_3f + 0x17),0);
  iVar2 = *pvVar3;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
  *pvVar4 = (double)iVar2;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(local_3f + 0x17),1);
  iVar2 = *pvVar3;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,1);
  *pvVar4 = (double)iVar2;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(local_3f + 0x17),2);
  iVar2 = *pvVar3;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,2);
  *pvVar4 = (double)iVar2;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(local_3f + 0x17),3);
  this_00 = (vector<int,_std::allocator<int>_> *)((double)*pvVar3 / 1000000000.0);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,3);
  *pvVar4 = (value_type)this_00;
  if (local_3f[2] == '-') {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
    *pvVar4 = *pvVar4 * -1.0;
  }
  local_3f[1] = 1;
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return in_RDI;
}

Assistant:

std::vector<double> CEAngle::HmsVect(void) const
{
    // Stores the resulting values
    std::vector<int> HMS_i(4);

    // Stores the sign
    char pm;
    iauA2tf(9, angle_, &pm, &HMS_i[0]);
    
    // Convert the values into doubles
    std::vector<double> HMS_d(HMS_i.size());
    // Scale the fraction to be a true fraction
    HMS_d[0] = double(HMS_i[0]);
    HMS_d[1] = double(HMS_i[1]);
    HMS_d[2] = double(HMS_i[2]);
    HMS_d[3] = double(HMS_i[3])/1.0e9;
    // Multiply the degree by a negative
    if (pm == '-') HMS_d[0] *= -1;

    return HMS_d;
}